

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O2

bool __thiscall
CppJieba::MPSegment::_cut
          (MPSegment *this,SegmentContext *segContext,
          vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_> *res)

{
  pointer pSVar1;
  value_type *__x;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  TrieNodeInfo nodeInfo;
  
  uVar3 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    pSVar1 = (segContext->
             super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(segContext->
                       super__Vector_base<CppJieba::SegmentChar,_std::allocator<CppJieba::SegmentChar>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x50) <= uVar4)
    break;
    __x = pSVar1[uVar4].pInfo;
    if (__x == (value_type *)0x0) {
      nodeInfo.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nodeInfo.freq = 0;
      nodeInfo.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nodeInfo.word.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      nodeInfo.tag._M_dataplus._M_p = (pointer)&nodeInfo.tag.field_2;
      nodeInfo.tag._M_string_length = 0;
      nodeInfo.tag.field_2._M_local_buf[0] = '\0';
      nodeInfo.logFreq = 0.0;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&nodeInfo.word,&pSVar1[uVar4].uniCh);
      nodeInfo.freq = 0;
      nodeInfo.logFreq = (this->_trie)._minLogFreq;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (res,&nodeInfo);
      TrieNodeInfo::~TrieNodeInfo(&nodeInfo);
      iVar2 = 1;
    }
    else {
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (res,__x);
      iVar2 = (int)((ulong)((long)(__x->word).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(__x->word).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 1);
    }
    uVar3 = uVar3 + iVar2;
  }
  return true;
}

Assistant:

bool _cut(SegmentContext& segContext, vector<TrieNodeInfo>& res)const
            {
                uint i = 0;
                while(i < segContext.size())
                {
                    const TrieNodeInfo* p = segContext[i].pInfo;
                    if(p)
                    {
                        res.push_back(*p);
                        i += p->word.size();
                    }
                    else//single chinese word
                    {
                        TrieNodeInfo nodeInfo;
                        nodeInfo.word.push_back(segContext[i].uniCh);
                        nodeInfo.freq = 0;
                        nodeInfo.logFreq = _trie.getMinLogFreq();
                        res.push_back(nodeInfo);
                        i++;
                    }
                }
                return true;
            }